

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

int ImfHeaderSetM33fAttribute(ImfHeader *hdr,char *name,float (*m) [3])

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Iterator IVar6;
  iterator iVar7;
  TypedAttribute<Imath_3_2::Matrix33<float>_> *pTVar8;
  Matrix33<float> local_78;
  TypedAttribute<Imath_3_2::Matrix33<float>_> local_48;
  
  uVar2 = *(undefined8 *)*m;
  uVar3 = *(undefined8 *)(*m + 2);
  uVar4 = *(undefined8 *)(m[1] + 1);
  uVar5 = *(undefined8 *)m[2];
  fVar1 = m[2][2];
  local_78.x[0]._0_8_ = uVar2;
  local_78.x._8_8_ = uVar3;
  local_78.x[1]._4_8_ = uVar4;
  local_78.x[2]._0_8_ = uVar5;
  local_78.x[2][2] = fVar1;
  IVar6 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar7._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar6._i._M_node == (iterator)iVar7._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::TypedAttribute(&local_48,&local_78);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_48.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::~TypedAttribute(&local_48);
  }
  else {
    pTVar8 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>>
                       ((Header *)hdr,name);
    *(undefined8 *)(pTVar8->_value).x[0] = uVar2;
    *(undefined8 *)((pTVar8->_value).x[0] + 2) = uVar3;
    *(undefined8 *)((pTVar8->_value).x[1] + 1) = uVar4;
    *(undefined8 *)(pTVar8->_value).x[2] = uVar5;
    (pTVar8->_value).x[2][2] = fVar1;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetM33fAttribute (
    ImfHeader* hdr, const char name[], const float m[3][3])
{
    try
    {
        M33f m3 (m);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::M33fAttribute (m3));
        else
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::M33fAttribute> (name)
                .value () = m3;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}